

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauGia.c
# Opt level: O3

int Dau_DsdToGia2_rec(Gia_Man_t *pGia,char *pStr,char **p,int *pMatches,int *pLits,Vec_Int_t *vCover
                     )

{
  byte bVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  byte *pbVar7;
  char *pcVar8;
  byte *pbVar9;
  long lVar10;
  char *pcVar11;
  int Temp [3];
  Vec_Int_t vLeaves;
  int Fanins [12];
  int local_278 [12];
  Vec_Int_t local_248;
  word local_238 [65];
  
  pbVar7 = (byte *)*p;
  bVar1 = *pbVar7;
  bVar3 = bVar1;
  if (bVar1 == 0x21) {
    *p = (char *)(pbVar7 + 1);
    pbVar9 = pbVar7 + 1;
    pbVar7 = pbVar7 + 1;
    bVar3 = *pbVar9;
  }
  if ((byte)(bVar3 + 0x9f) < 0xc) {
    uVar5 = pLits[(ulong)bVar3 - 0x61];
  }
  else {
    if (bVar3 == 0x5b) {
      if (pStr[pMatches[(long)pbVar7 - (long)pStr]] != ']') {
        __assert_fail("**p == \'[\' && *q == \']\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                      ,0x70,
                      "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      pbVar9 = (byte *)(pStr + pMatches[(long)pbVar7 - (long)pStr]);
      pbVar7 = pbVar7 + 1;
      *p = (char *)pbVar7;
      uVar5 = 0;
      if (pbVar9 <= pbVar7) {
        if (pbVar7 != pbVar9) goto LAB_004c3a25;
        goto LAB_004c3a4a;
      }
      do {
        iVar4 = Dau_DsdToGia2_rec(pGia,pStr,p,pMatches,pLits,vCover);
        if (pGia->pMuxes == (uint *)0x0) {
          uVar5 = Gia_ManHashXor(pGia,uVar5,iVar4);
        }
        else {
          uVar5 = Gia_ManHashXorReal(pGia,uVar5,iVar4);
        }
        pbVar7 = (byte *)(*p + 1);
        *p = (char *)pbVar7;
      } while (pbVar7 < pbVar9);
      if (pbVar7 != pbVar9) {
LAB_004c3a25:
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                      ,0x79,
                      "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
LAB_004c38f4:
      if (-1 < (int)uVar5) {
LAB_004c3a4a:
        return bVar1 == 0x21 ^ uVar5;
      }
      goto LAB_004c3a9c;
    }
    if (bVar3 == 0x3c) {
      lVar10 = (long)pMatches[(long)pbVar7 - (long)pStr];
      uVar5 = 0;
      if (pStr[lVar10 + 1] == '{') {
        pcVar8 = pStr + lVar10 + 1;
        *p = pcVar8;
        if ((*pcVar8 != '{') ||
           (pcVar8 = pStr + pMatches[(long)pcVar8 - (long)pStr], *pcVar8 != '}')) {
          __assert_fail("**p == \'{\' && *q2 == \'}\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                        ,0x89,
                        "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        pcVar11 = pStr + lVar10 + 2;
        *p = pcVar11;
        lVar10 = 0;
        if (pcVar11 < pcVar8) {
          lVar10 = 0;
          do {
            iVar4 = Dau_DsdToGia2_rec(pGia,pStr,p,pMatches,pLits,vCover);
            *(int *)((long)local_238 + lVar10 * 4) = iVar4;
            pcVar11 = *p + 1;
            *p = pcVar11;
            lVar10 = lVar10 + 1;
          } while (pcVar11 < pcVar8);
        }
        uVar5 = (uint)lVar10;
        if (pcVar11 != pcVar8) {
          __assert_fail("*p == q2",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                        ,0x8c,
                        "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        lVar10 = (long)pMatches[(long)pbVar7 - (long)pStr];
        pLits = (int *)local_238;
      }
      *p = (char *)pbVar7;
      if ((*pbVar7 != 0x3c) || (pbVar9 = (byte *)(pStr + lVar10), *pbVar9 != 0x3e)) {
        __assert_fail("**p == \'<\' && *q == \'>\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                      ,0x94,
                      "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      pbVar2 = pbVar7;
      if (uVar5 != 0) {
        for (; pbVar2 < pbVar9; pbVar2 = pbVar2 + 1) {
          if (((byte)(*pbVar2 + 0x9f) < 0x1a) && (uVar5 <= (byte)(*pbVar2 + 0x9f))) {
            __assert_fail("*pOld - \'a\' < nVars",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                          ,0x99,
                          "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                         );
          }
        }
      }
      *p = (char *)(pbVar7 + 1);
      if (pbVar9 <= pbVar7 + 1) {
LAB_004c3af9:
        __assert_fail("pTemp == Temp + 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                      ,0x9d,
                      "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      lVar10 = 0;
      do {
        iVar4 = Dau_DsdToGia2_rec(pGia,pStr,p,pMatches,pLits,vCover);
        *(int *)((long)local_278 + lVar10) = iVar4;
        lVar10 = lVar10 + 4;
        pcVar8 = *p;
        pbVar7 = (byte *)(pcVar8 + 1);
        *p = (char *)pbVar7;
      } while (pbVar7 < pbVar9);
      if (lVar10 != 0xc) goto LAB_004c3af9;
      if (pbVar7 != pbVar9) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                      ,0x9e,
                      "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      if (pbVar9[1] == 0x7b) {
        *p = pcVar8 + 2;
        if ((pcVar8[2] != '{') || (pStr[pMatches[(long)(pcVar8 + 2) - (long)pStr]] != '}')) {
          __assert_fail("**p == \'{\' && *q == \'}\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                        ,0xa2,
                        "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        *p = pStr + pMatches[(long)(pcVar8 + 2) - (long)pStr];
      }
      if (pGia->pMuxes == (uint *)0x0) {
        uVar5 = Gia_ManHashMux(pGia,local_278[0],local_278[1],local_278[2]);
      }
      else {
        uVar5 = Gia_ManHashMuxReal(pGia,local_278[0],local_278[1],local_278[2]);
      }
    }
    else {
      if (bVar3 == 0x28) {
        if (pStr[pMatches[(long)pbVar7 - (long)pStr]] != ')') {
          __assert_fail("**p == \'(\' && *q == \')\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                        ,99,
                        "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        pbVar9 = (byte *)(pStr + pMatches[(long)pbVar7 - (long)pStr]);
        pbVar7 = pbVar7 + 1;
        *p = (char *)pbVar7;
        uVar5 = 1;
        if (pbVar9 <= pbVar7) {
          if (pbVar7 == pbVar9) goto LAB_004c3a4a;
LAB_004c3b94:
          __assert_fail("*p == q",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                        ,0x69,
                        "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        do {
          iVar4 = Dau_DsdToGia2_rec(pGia,pStr,p,pMatches,pLits,vCover);
          uVar5 = Gia_ManHashAnd(pGia,uVar5,iVar4);
          pbVar7 = (byte *)(*p + 1);
          *p = (char *)pbVar7;
        } while (pbVar7 < pbVar9);
        if (pbVar7 != pbVar9) goto LAB_004c3b94;
        goto LAB_004c38f4;
      }
      if (5 < (byte)(bVar3 + 0xbf) && 9 < (byte)(bVar3 - 0x30)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                      ,0xc0,
                      "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      iVar4 = Abc_TtReadHex(local_238,(char *)pbVar7);
      iVar6 = 1 << ((char)iVar4 - 2U & 0x1f);
      if (iVar4 < 3) {
        iVar6 = 1;
      }
      pcVar11 = *p;
      pcVar8 = pcVar11 + iVar6;
      *p = pcVar8;
      if ((pcVar11[iVar6] != '{') ||
         (pcVar11 = pStr + pMatches[(long)pcVar8 - (long)pStr], *pcVar11 != '}')) {
        __assert_fail("**p == \'{\' && *q == \'}\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                      ,0xb3,
                      "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      pcVar8 = pcVar8 + 1;
      *p = pcVar8;
      lVar10 = 0;
      if (pcVar8 < pcVar11) {
        lVar10 = 0;
        do {
          iVar6 = Dau_DsdToGia2_rec(pGia,pStr,p,pMatches,pLits,vCover);
          local_278[lVar10] = iVar6;
          pcVar8 = *p + 1;
          *p = pcVar8;
          lVar10 = lVar10 + 1;
        } while (pcVar8 < pcVar11);
      }
      if ((int)lVar10 != iVar4) {
        __assert_fail("i == nVars",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                      ,0xb6,
                      "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      if (pcVar8 != pcVar11) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                      ,0xb7,
                      "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      local_248.pArray = local_278;
      local_248.nCap = iVar4;
      local_248.nSize = iVar4;
      uVar5 = Kit_TruthToGia(pGia,(uint *)local_238,iVar4,vCover,&local_248,1);
      m_Non1Step = m_Non1Step + 1;
    }
  }
  if (-1 < (int)uVar5) {
    return uVar5 ^ bVar1 == 0x21;
  }
LAB_004c3a9c:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                ,0xf5,"int Abc_LitNotCond(int, int)");
}

Assistant:

int Dau_DsdToGia2_rec( Gia_Man_t * pGia, char * pStr, char ** p, int * pMatches, int * pLits, Vec_Int_t * vCover )
{
    int fCompl = 0;
    if ( **p == '!' )
        (*p)++, fCompl = 1;
    if ( **p >= 'a' && **p < 'a' + DAU_DSD_MAX_VAR ) // var
        return Abc_LitNotCond( pLits[**p - 'a'], fCompl );
    if ( **p == '(' ) // and/or
    {
        char * q = pStr + pMatches[ *p - pStr ];
        int Res = 1, Lit;
        assert( **p == '(' && *q == ')' );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Lit = Dau_DsdToGia2_rec( pGia, pStr, p, pMatches, pLits, vCover );
            Res = Gia_ManHashAnd( pGia, Res, Lit );
        }
        assert( *p == q );
        return Abc_LitNotCond( Res, fCompl );
    }
    if ( **p == '[' ) // xor
    {
        char * q = pStr + pMatches[ *p - pStr ];
        int Res = 0, Lit;
        assert( **p == '[' && *q == ']' );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Lit = Dau_DsdToGia2_rec( pGia, pStr, p, pMatches, pLits, vCover );
            if ( pGia->pMuxes )
                Res = Gia_ManHashXorReal( pGia, Res, Lit );
            else
                Res = Gia_ManHashXor( pGia, Res, Lit );
        }
        assert( *p == q );
        return Abc_LitNotCond( Res, fCompl );
    }
    if ( **p == '<' ) // mux
    {
        int nVars = 0;
        int Temp[3], * pTemp = Temp, Res;
        int Fanins[DAU_DSD_MAX_VAR], * pLits2;
        char * pOld = *p;
        char * q = pStr + pMatches[ *p - pStr ];
        // read fanins
        if ( *(q+1) == '{' )
        {
            char * q2;
            *p = q+1;
            q2 = pStr + pMatches[ *p - pStr ];
            assert( **p == '{' && *q2 == '}' );
            for ( nVars = 0, (*p)++; *p < q2; (*p)++, nVars++ )
                Fanins[nVars] = Dau_DsdToGia2_rec( pGia, pStr, p, pMatches, pLits, vCover );
            assert( *p == q2 );
            pLits2 = Fanins;
        }
        else
            pLits2 = pLits;
        // read MUX
        *p = pOld;
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '<' && *q == '>' );
        // verify internal variables
        if ( nVars )
            for ( ; pOld < q; pOld++ )
                if ( *pOld >= 'a' && *pOld <= 'z' )
                    assert( *pOld - 'a' < nVars );
        // derive MUX components
        for ( (*p)++; *p < q; (*p)++ )
            *pTemp++ = Dau_DsdToGia2_rec( pGia, pStr, p, pMatches, pLits2, vCover );
        assert( pTemp == Temp + 3 );
        assert( *p == q );
        if ( *(q+1) == '{' ) // and/or
        {
            char * q = pStr + pMatches[ ++(*p) - pStr ];
            assert( **p == '{' && *q == '}' );
            *p = q;
        }
        if ( pGia->pMuxes )
            Res = Gia_ManHashMuxReal( pGia, Temp[0], Temp[1], Temp[2] );
        else
            Res = Gia_ManHashMux( pGia, Temp[0], Temp[1], Temp[2] );
        return Abc_LitNotCond( Res, fCompl );
    }
    if ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
    {
        Vec_Int_t vLeaves;  char * q;
        word pFunc[DAU_DSD_MAX_VAR > 6 ? (1 << (DAU_DSD_MAX_VAR-6)) : 1];
        int Fanins[DAU_DSD_MAX_VAR], Res; 
        int i, nVars = Abc_TtReadHex( pFunc, *p );
        *p += Abc_TtHexDigitNum( nVars );
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '{' && *q == '}' );
        for ( i = 0, (*p)++; *p < q; (*p)++, i++ )
            Fanins[i] = Dau_DsdToGia2_rec( pGia, pStr, p, pMatches, pLits, vCover );
        assert( i == nVars );
        assert( *p == q );
//        Res = Dau_DsdToGia2Compose_rec( pGia, Func, Fanins, nVars );
        vLeaves.nCap = nVars;
        vLeaves.nSize = nVars;
        vLeaves.pArray = Fanins;        
        Res = Kit_TruthToGia( pGia, (unsigned *)pFunc, nVars, vCover, &vLeaves, 1 );
        m_Non1Step++;
        return Abc_LitNotCond( Res, fCompl );
    }
    assert( 0 );
    return 0;
}